

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char cVar10;
  
  bVar1 = IsClamped(this);
  if (!bVar1) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x23c,"bool FIX::double_conversion::Bignum::ToHexString(char *, int) const");
  }
  uVar5 = this->used_digits_;
  if ((ulong)uVar5 == 0) {
    if (buffer_size < 2) {
      return false;
    }
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  if ((0 < (int)uVar5) && ((int)uVar5 <= (this->bigits_).length_)) {
    uVar6 = (this->bigits_).start_[(ulong)uVar5 - 1];
    if (uVar6 == 0) {
      __assert_fail("number > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                    ,0x22a,"int FIX::double_conversion::SizeInHexChars(S) [S = unsigned int]");
    }
    iVar3 = (this->exponent_ + uVar5) * 7 + -8;
    do {
      iVar7 = iVar3;
      iVar3 = iVar7 + 1;
      bVar1 = 0xf < uVar6;
      uVar6 = uVar6 >> 4;
    } while (bVar1);
    iVar7 = iVar7 + 2;
    if (buffer_size <= iVar7) {
      return false;
    }
    buffer[iVar7] = '\0';
    if (0 < this->exponent_) {
      iVar7 = 0;
      do {
        builtin_strncpy(buffer + (long)iVar3 + -3,"0000",4);
        builtin_strncpy(buffer + (long)iVar3 + -6,"0000",4);
        iVar3 = iVar3 + -7;
        iVar7 = iVar7 + 1;
      } while (iVar7 < this->exponent_);
    }
    iVar7 = this->used_digits_;
    if (iVar7 < 2) {
      uVar9 = (ulong)(iVar7 - 1);
    }
    else {
      lVar2 = 0;
      do {
        iVar4 = iVar3;
        if ((this->bigits_).length_ <= lVar2) goto LAB_00165a85;
        uVar5 = (this->bigits_).start_[lVar2];
        pcVar8 = buffer + iVar4;
        iVar3 = 0;
        do {
          cVar10 = '7';
          if ((uVar5 & 0xf) < 10) {
            cVar10 = '0';
          }
          *pcVar8 = cVar10 + (char)(uVar5 & 0xf);
          uVar5 = uVar5 >> 4;
          iVar3 = iVar3 + 1;
          pcVar8 = pcVar8 + -1;
        } while (iVar3 != 7);
        lVar2 = lVar2 + 1;
        iVar7 = this->used_digits_;
        uVar9 = (long)iVar7 - 1;
        iVar3 = iVar4 + -7;
      } while (lVar2 < (long)uVar9);
      iVar3 = iVar4 + -7;
    }
    if ((0 < iVar7) && (iVar7 <= (this->bigits_).length_)) {
      uVar5 = (this->bigits_).start_[uVar9 & 0xffffffff];
      if (uVar5 != 0) {
        pcVar8 = buffer + iVar3;
        do {
          cVar10 = '7';
          if ((uVar5 & 0xf) < 10) {
            cVar10 = '0';
          }
          *pcVar8 = cVar10 + (char)(uVar5 & 0xf);
          pcVar8 = pcVar8 + -1;
          bVar1 = 0xf < uVar5;
          uVar5 = uVar5 >> 4;
        } while (bVar1);
        return true;
      }
      return true;
    }
  }
LAB_00165a85:
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xca,
                "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
               );
}

Assistant:

bool Bignum::ToHexString(char* buffer, int buffer_size) const {
  ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  ASSERT(kBigitSize % 4 == 0);
  const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_digits_ == 0) {
    if (buffer_size < 2) return false;
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
      SizeInHexChars(bigits_[used_digits_ - 1]) + 1;
  if (needed_chars > buffer_size) return false;
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_digits_ - 1; ++i) {
    Chunk current_bigit = bigits_[i];
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = bigits_[used_digits_ - 1];
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}